

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall
Generators_Hammersley2D_Test::~Generators_Hammersley2D_Test(Generators_Hammersley2D_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Generators, Hammersley2D) {
    int count = 0;
    for (Point2f u : Hammersley2D(32)) {
        EXPECT_EQ((Float)count / 32.f, u[0]);
        EXPECT_EQ(RadicalInverse(0, count), u[1]);
        ++count;
    }
    EXPECT_EQ(32, count);
}